

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molly-test.cc
# Opt level: O3

int main(void)

{
  DeviceState DVar1;
  int __oflag;
  long lVar2;
  char *pcVar3;
  ostream *poVar4;
  DeviceState lastState;
  Device device;
  DeviceState local_58;
  Device local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  molly::Device::Device(&local_54);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/dev/big_red_button","");
  molly::Device::open(&local_54,(char *)local_50,__oflag);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_58 = Unknown;
LAB_001023f6:
  DVar1 = molly::Device::sample(&local_54);
  if (DVar1 != LidClosed) {
    if (DVar1 != ButtonPressed) goto code_r0x0010240a;
    lVar2 = 8;
    pcVar3 = "PRESS!!!";
    if (local_58 == ButtonPressed) goto LAB_001024a2;
    goto LAB_00102432;
  }
  if (local_58 != LidClosed) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Closed from ",0xc);
    poVar4 = molly::operator<<((ostream *)&std::cout,&local_58);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    goto LAB_0010248f;
  }
  goto LAB_001024a2;
code_r0x0010240a:
  if (DVar1 == LidOpen) {
    lVar2 = 7;
    pcVar3 = "OPEN...";
    if ((uint)(local_58 + ~LidOpen) < 0xfffffffe) {
LAB_00102432:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      poVar4 = (ostream *)&std::cout;
LAB_0010248f:
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
LAB_001024a2:
    local_58 = DVar1;
    usleep(20000);
  }
  goto LAB_001023f6;
}

Assistant:

int main()
{
  Device device;
  device.open("/dev/big_red_button");

  DeviceState lastState = DeviceState::Unknown;

#pragma clang diagnostic push
#pragma clang diagnostic ignored "-Wmissing-noreturn"
  while (true)
  {
    DeviceState state = device.sample();

    switch (state)
    {
      case DeviceState::ButtonPressed:
        if (lastState != DeviceState::ButtonPressed)
          cout << "PRESS!!!" << endl;
        break;
      case DeviceState::LidOpen:
        if (lastState != DeviceState::LidOpen && lastState != DeviceState::ButtonPressed)
          cout << "OPEN..." << endl;
        break;
      case DeviceState::LidClosed:
        if (lastState != DeviceState::LidClosed)
          cout << "Closed from " << lastState << endl;
        break;
      default:
        continue;
    }

    lastState = state;

    usleep(20000);
  }
#pragma clang diagnostic pop
}